

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O3

void __thiscall CodeGenerator::writeIncludes(CodeGenerator *this,ostream *s,Class *clazz)

{
  _Rb_tree_header *p_Var1;
  pointer pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  _Base_ptr p_Var3;
  iterator iVar4;
  long *plVar5;
  ostream *poVar6;
  size_type *psVar7;
  pointer pRVar8;
  undefined1 local_190 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
  i;
  _Alloc_hider local_150;
  char local_140 [16];
  _Alloc_hider local_130;
  char local_120 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  _Alloc_hider local_f0;
  char local_e0 [16];
  _Alloc_hider local_d0;
  char local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&includes;
  includes._M_t._M_impl._0_4_ = 0;
  includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  includes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var3 = (this->m_classes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_classes)._M_t._M_impl.super__Rb_tree_header;
  includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  includes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    psVar7 = &i.first._M_string_length;
    do {
      local_190 = (undefined1  [8])psVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      i.first.field_2._8_8_ = *(undefined8 *)(p_Var3 + 2);
      if (*(long *)(i.first.field_2._8_8_ + 0x28) != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (i.first.field_2._8_8_ + 0x20));
      }
      if (local_190 != (undefined1  [8])psVar7) {
        operator_delete((void *)local_190);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  pRVar2 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar8 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>.
                _M_impl.super__Vector_impl_data._M_start; pRVar8 != pRVar2; pRVar8 = pRVar8 + 1) {
    Replicator::Replicator((Replicator *)local_190,pRVar8);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                    *)includes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (key_type *)((long)&i.first.field_2 + 8));
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               (iVar4._M_node + 2);
      if (*(char *)&__rhs[7]._M_dataplus._M_p == '\0') {
        std::operator+(&local_b0,"generated_",__rhs);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_50.field_2._M_allocated_capacity = *psVar7;
          local_50.field_2._8_8_ = plVar5[3];
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar7;
          local_50._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_50._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_90,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      else if (__rhs[1]._M_string_length != 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_90,__rhs + 1);
      }
    }
    if (local_d0._M_p != local_c0) {
      operator_delete(local_d0._M_p);
    }
    if (local_f0._M_p != local_e0) {
      operator_delete(local_f0._M_p);
    }
    if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100._M_pi);
    }
    if (local_130._M_p != local_120) {
      operator_delete(local_130._M_p);
    }
    if (local_150._M_p != local_140) {
      operator_delete(local_150._M_p);
    }
    if ((undefined1 *)i.first.field_2._8_8_ != &stack0xfffffffffffffea0) {
      operator_delete((void *)i.first.field_2._8_8_);
    }
    if (local_190 != (undefined1  [8])&i.first._M_string_length) {
      operator_delete((void *)local_190);
    }
  }
  if (includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&includes) {
    psVar7 = &i.first._M_string_length;
    p_Var3 = includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      local_190 = (undefined1  [8])psVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      std::__ostream_insert<char,std::char_traits<char>>(s,"#include \"",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (s,(char *)local_190,(long)i.first._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (local_190 != (undefined1  [8])psVar7) {
        operator_delete((void *)local_190);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)&includes);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + (char)s);
  std::ostream::put((char)s);
  std::ostream::flush();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
  return;
}

Assistant:

void CodeGenerator::writeIncludes(std::ostream &s, Class *clazz)
{
    std::set<std::string> includes;

    // First add all imported classes' includes.
    for (auto i : m_classes) {
        const Class *c = i.second;
        if (!c->include.empty())
            includes.insert(i.second->include);
    }
    // Then include all includes to classes we're replecating..
    // ### We should be checking for cyclic deps here..
    for (auto replicator : clazz->replicators) {
        auto classIt = m_classes.find(replicator.clazz);
        if (classIt != m_classes.end()) {
            Class *c = classIt->second;
            if (!c->declarationOnly) {
                // a generated class,
                includes.insert("generated_" + c->name + ".h");
            } else if (!c->include.empty()) {
                includes.insert(c->include);
            }
        }
    }

    for (auto i : includes)
        s << "#include \"" << i << "\"" << std::endl;
    s << std::endl;
}